

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundle_adjustment.cc
# Opt level: O2

void __thiscall
sfm::ba::BundleAdjustment::analytic_jacobian
          (BundleAdjustment *this,SparseMatrixType *jac_cam,SparseMatrixType *jac_points)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  pointer pCVar6;
  pointer pCVar7;
  pointer pPVar8;
  pointer pPVar9;
  vector<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_> *this_00;
  size_t rows;
  long lVar10;
  reference pvVar11;
  reference point;
  reference cam;
  long lVar12;
  int iVar13;
  double *pdVar14;
  int iVar15;
  ulong __n;
  double *in_stack_fffffffffffffe80;
  double local_178;
  double cam_x_ptr [9];
  double local_128;
  double cam_y_ptr [9];
  double local_d8;
  double point_x_ptr [3];
  double local_b8;
  double point_y_ptr [3];
  undefined1 auStack_88 [8];
  Triplets cam_triplets;
  undefined1 auStack_68 [8];
  Triplets point_triplets;
  
  pCVar6 = (this->cameras->super__Vector_base<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar7 = (this->cameras->super__Vector_base<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar8 = (this->points->super__Vector_base<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pPVar9 = (this->points->super__Vector_base<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>).
           _M_impl.super__Vector_impl_data._M_start;
  iVar4 = this->num_cam_params;
  lVar10 = ((long)(this->observations->
                  super__Vector_base<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->observations->
                 super__Vector_base<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>).
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
  cam_triplets.
  super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  point_triplets.
  super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_88 = (undefined1  [8])0x0;
  cam_triplets.
  super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  point_triplets.
  super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (jac_cam != (SparseMatrixType *)0x0) {
    std::
    vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
    ::resize((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
              *)auStack_88,iVar4 * lVar10 * 2);
  }
  if (jac_points != (SparseMatrixType *)0x0) {
    std::
    vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
    ::resize((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
              *)auStack_68,
             (long)(this->observations->
                   super__Vector_base<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->observations->
                   super__Vector_base<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2);
  }
  rows = lVar10 * 2;
  point_triplets.
  super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x28;
  lVar10 = 0;
  __n = 0;
  while( true ) {
    this_00 = this->observations;
    if ((ulong)(((long)(this_00->
                       super__Vector_base<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->
                      super__Vector_base<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x18) <= __n) break;
    pvVar11 = std::vector<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>::at
                        (this_00,__n);
    point = std::vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>::at
                      (this->points,(long)pvVar11->point_id);
    cam = std::vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>::at
                    (this->cameras,(long)pvVar11->camera_id);
    analytic_jacobian_entries
              (this,cam,point,&local_178,&local_128,&local_d8,in_stack_fffffffffffffe80);
    if (point->is_constant == true) {
      for (lVar12 = 0; lVar12 != 0x18; lVar12 = lVar12 + 8) {
        *(undefined8 *)((long)point_x_ptr + lVar12 + -8) = 0;
      }
      for (lVar12 = 0; lVar12 != 0x18; lVar12 = lVar12 + 8) {
        *(undefined8 *)((long)point_y_ptr + lVar12 + -8) = 0;
      }
    }
    iVar5 = pvVar11->point_id;
    dVar2 = (double)(__n * 2 + 1);
    if (jac_cam != (SparseMatrixType *)0x0) {
      iVar15 = this->num_cam_params;
      iVar13 = pvVar11->camera_id * iVar15;
      pdVar14 = (double *)((long)&((pointer)((long)auStack_88 + 0x18))->value + iVar15 * lVar10);
      for (lVar12 = 0; lVar12 < iVar15; lVar12 = lVar12 + 1) {
        dVar1 = (double)(iVar13 + lVar12);
        dVar3 = cam_x_ptr[lVar12 + -1];
        pdVar14[-5] = (double)(__n * 2);
        pdVar14[-4] = dVar1;
        pdVar14[-3] = dVar3;
        dVar3 = cam_y_ptr[lVar12 + -1];
        ((Triplet *)(pdVar14 + -2))->row = (size_t)dVar2;
        pdVar14[-1] = dVar1;
        *pdVar14 = dVar3;
        iVar15 = this->num_cam_params;
        pdVar14 = pdVar14 + 6;
      }
    }
    if (jac_points != (SparseMatrixType *)0x0) {
      pdVar14 = (double *)
                ((long)&(point_triplets.
                         super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->row +
                (long)(size_t *)auStack_68);
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        dVar1 = (double)(iVar5 * 3 + lVar12);
        dVar3 = point_x_ptr[lVar12 + -1];
        pdVar14[-5] = (double)(__n * 2);
        pdVar14[-4] = dVar1;
        pdVar14[-3] = dVar3;
        dVar3 = point_y_ptr[lVar12 + -1];
        pdVar14[-2] = dVar2;
        pdVar14[-1] = dVar1;
        *pdVar14 = dVar3;
        pdVar14 = pdVar14 + 6;
      }
    }
    __n = __n + 1;
    lVar10 = lVar10 + 0x30;
    point_triplets.
    super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         point_triplets.
         super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage + 6;
  }
  if (jac_cam != (SparseMatrixType *)0x0) {
    SparseMatrix<double>::allocate(jac_cam,rows,((long)pCVar6 - (long)pCVar7 >> 7) * (long)iVar4);
    SparseMatrix<double>::set_from_triplets(jac_cam,(Triplets *)auStack_88);
  }
  if (jac_points != (SparseMatrixType *)0x0) {
    SparseMatrix<double>::allocate(jac_points,rows,((long)pPVar8 - (long)pPVar9 >> 5) * 3);
    SparseMatrix<double>::set_from_triplets(jac_points,(Triplets *)auStack_68);
  }
  std::
  _Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::~_Vector_base((_Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                   *)auStack_68);
  std::
  _Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::~_Vector_base((_Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                   *)auStack_88);
  return;
}

Assistant:

void
BundleAdjustment::analytic_jacobian (SparseMatrixType* jac_cam,
    SparseMatrixType* jac_points)
{
    std::size_t const camera_cols = this->cameras->size() * this->num_cam_params;
    std::size_t const point_cols = this->points->size() * 3;
    std::size_t const jacobi_rows = this->observations->size() * 2;

    SparseMatrixType::Triplets cam_triplets, point_triplets;
    if (jac_cam != nullptr)
        cam_triplets.resize(this->observations->size() * 2
            * this->num_cam_params);
    if (jac_points != nullptr)
        point_triplets.resize(this->observations->size() * 3 * 2);

#pragma omp parallel
    {
        double cam_x_ptr[9], cam_y_ptr[9], point_x_ptr[3], point_y_ptr[3];
#pragma omp for
        for (std::size_t i = 0; i < this->observations->size(); ++i)
        {
            Observation const& obs = this->observations->at(i);
            Point3D const& p3d = this->points->at(obs.point_id);
            Camera const& cam = this->cameras->at(obs.camera_id);
            this->analytic_jacobian_entries(cam, p3d,
                cam_x_ptr, cam_y_ptr, point_x_ptr, point_y_ptr);

            if (p3d.is_constant)
            {
                std::fill(point_x_ptr, point_x_ptr + 3, 0.0);
                std::fill(point_y_ptr, point_y_ptr + 3, 0.0);
            }

            std::size_t row_x = i * 2, row_y = row_x + 1;
            std::size_t cam_col = obs.camera_id * this->num_cam_params;
            std::size_t point_col = obs.point_id * 3;
            std::size_t cam_offset = i * this->num_cam_params * 2;
            for (int j = 0; jac_cam != nullptr && j < this->num_cam_params; ++j)
            {
                cam_triplets[cam_offset + j * 2 + 0] =
                    SparseMatrixType::Triplet(row_x, cam_col + j, cam_x_ptr[j]);
                cam_triplets[cam_offset + j * 2 + 1] =
                    SparseMatrixType::Triplet(row_y, cam_col + j, cam_y_ptr[j]);
            }
            std::size_t point_offset = i * 3 * 2;
            for (int j = 0; jac_points != nullptr && j < 3; ++j)
            {
                point_triplets[point_offset + j * 2 + 0] =
                    SparseMatrixType::Triplet(row_x, point_col + j, point_x_ptr[j]);
                point_triplets[point_offset + j * 2 + 1] =
                    SparseMatrixType::Triplet(row_y, point_col + j, point_y_ptr[j]);
            }
        }

#pragma omp sections
        {
#pragma omp section
            if (jac_cam != nullptr)
            {
                jac_cam->allocate(jacobi_rows, camera_cols);
                jac_cam->set_from_triplets(cam_triplets);
            }

#pragma omp section
            if (jac_points != nullptr)
            {
                jac_points->allocate(jacobi_rows, point_cols);
                jac_points->set_from_triplets(point_triplets);
            }
        }
    }
}